

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<Header>::remove(QList<Header> *this,char *__filename)

{
  QList<Header> *extraout_RAX;
  long in_RDX;
  qsizetype unaff_retaddr;
  Header *in_stack_00000008;
  QGenericArrayOps<Header> *in_stack_00000010;
  QArrayDataPointer<Header> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<Header>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<Header>::operator->(&this->d);
    QArrayDataPointer<Header>::operator->(&this->d);
    QArrayDataPointer<Header>::begin((QArrayDataPointer<Header> *)0x1d9539);
    QtPrivate::QGenericArrayOps<Header>::erase(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}